

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void jx9RegisterBuiltInConstant(jx9_vm *pVm)

{
  char cVar1;
  char *pcVar2;
  ProcConstant xExpand;
  char *pcVar3;
  ushort **ppuVar4;
  uint uVar5;
  char *pcVar6;
  sxu32 n;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  SyString local_40;
  
  lVar7 = 0;
LAB_0012aa29:
  if (pVm->nMagic != 0xdead2bad) {
    pcVar2 = aBuiltIn[lVar7].zName;
    pcVar6 = pcVar2;
    if (*pcVar2 != '\0') {
      pcVar3 = pcVar2 + 2;
      do {
        pcVar6 = pcVar3;
        if (pcVar6[-1] == '\0') {
          pcVar6 = pcVar6 + -1;
          goto LAB_0012aa87;
        }
        if (*pcVar6 == '\0') goto LAB_0012aa87;
        if (pcVar6[1] == '\0') {
          pcVar6 = pcVar6 + 1;
          goto LAB_0012aa87;
        }
        pcVar3 = pcVar6 + 4;
      } while (pcVar6[2] != '\0');
      pcVar6 = pcVar6 + 2;
    }
LAB_0012aa87:
    uVar5 = (int)pcVar6 - (int)pcVar2;
    if (uVar5 != 0) {
      xExpand = aBuiltIn[lVar7].xExpand;
      uVar9 = (ulong)uVar5;
      uVar8 = 0;
      do {
        cVar1 = pcVar2[uVar8];
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) == 0
           )) {
          local_40.zString = pcVar2 + uVar8;
          goto LAB_0012aad6;
        }
        uVar8 = uVar8 + 1;
      } while (uVar5 != (uint)uVar8);
    }
  }
  goto LAB_0012ab1f;
  while (uVar9 = uVar9 - 1, uVar8 != uVar9) {
LAB_0012aad6:
    cVar1 = pcVar2[uVar9 - 1];
    if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
       (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) == 0)) {
      local_40.nByte = (int)uVar9 - (int)uVar8;
      if (xExpand != (ProcConstant)0x0) {
        jx9VmRegisterConstant(pVm,&local_40,xExpand,pVm);
      }
      break;
    }
  }
LAB_0012ab1f:
  lVar7 = lVar7 + 1;
  if (lVar7 == 0x7a) {
    return;
  }
  goto LAB_0012aa29;
}

Assistant:

JX9_PRIVATE void jx9RegisterBuiltInConstant(jx9_vm *pVm)
{
	sxu32 n;
	/* 
	 * Note that all built-in constants have access to the jx9 virtual machine
	 * that trigger the constant invocation as their private data.
	 */
	for( n = 0 ; n < SX_ARRAYSIZE(aBuiltIn) ; ++n ){
		jx9_create_constant(&(*pVm), aBuiltIn[n].zName, aBuiltIn[n].xExpand, &(*pVm));
	}
}